

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

PropertyId __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetPropertyId
          (DictionaryTypeHandlerBase<unsigned_short> *this,ScriptContext *scriptContext,
          BigPropertyIndex index)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DictionaryPropertyDescriptor<unsigned_short> DVar1;
  bool bVar2;
  PropertyId PVar3;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar4;
  PropertyRecord **ppPVar5;
  
  this_00 = (this->propertyMap).ptr;
  if (index < this_00->count - this_00->freeCount) {
    pDVar4 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(this_00,index);
    DVar1 = *pDVar4;
    PVar3 = DVar1._0_4_;
    bVar2 = true;
    if ((((ulong)DVar1 >> 8 & 8) == 0) &&
       ((((ulong)DVar1 & 2) == 0 & (DVar1.Attributes & 0x10) >> 4) == 0)) {
      ppPVar5 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,index);
      PVar3 = (*ppPVar5)->pid;
      bVar2 = false;
    }
    if (!bVar2) {
      return PVar3;
    }
  }
  return -1;
}

Assistant:

PropertyId DictionaryTypeHandlerBase<T>::GetPropertyId(ScriptContext* scriptContext, BigPropertyIndex index)
    {
        if (index < propertyMap->Count())
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(index);
            if (!(descriptor.Attributes & PropertyDeleted) && descriptor.HasNonLetConstGlobal())
            {
                return propertyMap->GetKeyAt(index)->GetPropertyId();
            }
        }
        return Constants::NoProperty;
    }